

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O2

void __thiscall
capnp::JsonCodec::HexHandler::encode(HexHandler *this,JsonCodec *codec,Reader input,Builder output)

{
  ArrayPtr<const_unsigned_char> input_00;
  Reader value;
  Array<char> local_20;
  
  input_00.size_ = (uchar *)input.super_ArrayPtr<const_unsigned_char>.size_;
  input_00.ptr = input_00.size_;
  kj::encodeHex((String *)&local_20,(kj *)input.super_ArrayPtr<const_unsigned_char>.ptr,input_00);
  if (local_20.size_ == 0) {
    local_20.ptr = "";
  }
  value.super_StringPtr.content.size_ = local_20.size_ + (local_20.size_ == 0);
  value.super_StringPtr.content.ptr = local_20.ptr;
  capnp::json::Value::Builder::setString(&output,value);
  kj::Array<char>::~Array(&local_20);
  return;
}

Assistant:

void encode(const JsonCodec& codec, capnp::Data::Reader input,
              JsonValue::Builder output) const override {
    output.setString(kj::encodeHex(input));
  }